

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1-client.c
# Opt level: O0

ssh_rportfwd *
ssh1_rportfwd_alloc(ConnectionLayer *cl,char *shost,int sport,char *dhost,int dport,
                   int addressfamily,char *log_description,PortFwdRecord *pfr,
                   ssh_sharing_connstate *share_ctx)

{
  char *pcVar1;
  ssh_rportfwd *psVar2;
  PktOut *pPVar3;
  PktOut *pktout;
  ssh_rportfwd *rpf;
  ssh1_connection_state *s;
  int addressfamily_local;
  int dport_local;
  char *dhost_local;
  int sport_local;
  char *shost_local;
  ConnectionLayer *cl_local;
  
  cl_local = (ConnectionLayer *)safemalloc(1,0x38,0);
  pcVar1 = dupstr(shost);
  ((ssh_rportfwd *)cl_local)->shost = pcVar1;
  ((ssh_rportfwd *)cl_local)->sport = sport;
  pcVar1 = dupstr(dhost);
  ((ssh_rportfwd *)cl_local)->dhost = pcVar1;
  ((ssh_rportfwd *)cl_local)->dport = dport;
  ((ssh_rportfwd *)cl_local)->addressfamily = addressfamily;
  pcVar1 = dupstr(log_description);
  ((ssh_rportfwd *)cl_local)->log_description = pcVar1;
  ((ssh_rportfwd *)cl_local)->pfr = pfr;
  psVar2 = (ssh_rportfwd *)add234((tree234 *)cl[-6].logctx,cl_local);
  if (psVar2 == (ssh_rportfwd *)cl_local) {
    pPVar3 = ssh_bpp_new_pktout((BinaryPacketProtocol *)cl[1].vt,0x1c);
    BinarySink_put_uint32(pPVar3->binarysink_,(ulong)((ssh_rportfwd *)cl_local)->sport);
    BinarySink_put_stringz(pPVar3->binarysink_,((ssh_rportfwd *)cl_local)->dhost);
    BinarySink_put_uint32(pPVar3->binarysink_,(ulong)((ssh_rportfwd *)cl_local)->dport);
    pq_base_push((PacketQueueBase *)cl[2].vt,&pPVar3->qnode);
    ssh1_queue_succfail_handler
              ((ssh1_connection_state *)(cl + -0xe),ssh1_rportfwd_response,cl_local,false);
  }
  else {
    free_rportfwd((ssh_rportfwd *)cl_local);
    cl_local = (ConnectionLayer *)0x0;
  }
  return (ssh_rportfwd *)cl_local;
}

Assistant:

struct ssh_rportfwd *ssh1_rportfwd_alloc(
    ConnectionLayer *cl,
    const char *shost, int sport, const char *dhost, int dport,
    int addressfamily, const char *log_description, PortFwdRecord *pfr,
    ssh_sharing_connstate *share_ctx)
{
    struct ssh1_connection_state *s =
        container_of(cl, struct ssh1_connection_state, cl);
    struct ssh_rportfwd *rpf = snew(struct ssh_rportfwd);

    rpf->shost = dupstr(shost);
    rpf->sport = sport;
    rpf->dhost = dupstr(dhost);
    rpf->dport = dport;
    rpf->addressfamily = addressfamily;
    rpf->log_description = dupstr(log_description);
    rpf->pfr = pfr;

    if (add234(s->rportfwds, rpf) != rpf) {
        free_rportfwd(rpf);
        return NULL;
    }

    PktOut *pktout = ssh_bpp_new_pktout(
        s->ppl.bpp, SSH1_CMSG_PORT_FORWARD_REQUEST);
    put_uint32(pktout, rpf->sport);
    put_stringz(pktout, rpf->dhost);
    put_uint32(pktout, rpf->dport);
    pq_push(s->ppl.out_pq, pktout);

    ssh1_queue_succfail_handler(s, ssh1_rportfwd_response, rpf, false);

    return rpf;
}